

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

int http1_upgrade2sse(http_s *h,http_sse_s *sse)

{
  int *piVar1;
  _func_void_http_sse_s_ptr *uuid;
  void *pvVar2;
  _func_void_http_sse_s_ptr *p_Var3;
  _func_void_http_sse_s_ptr *p_Var4;
  _func_void_http_sse_s_ptr *p_Var5;
  FIOBJ FVar6;
  FIOBJ FVar7;
  fio_protocol_s *protocol;
  http_sse_s *phVar8;
  undefined4 local_97;
  undefined2 local_93;
  undefined1 local_91;
  
  uuid = *(_func_void_http_sse_s_ptr **)((h->private_data).flag + 0x30);
  h->status = 200;
  FVar7 = HTTP_HEADER_CONTENT_TYPE;
  FVar6 = HTTP_HVALUE_SSE_MIME;
  if ((((~(uint)HTTP_HVALUE_SSE_MIME & 6) != 0) && (HTTP_HVALUE_SSE_MIME != 0)) &&
     ((HTTP_HVALUE_SSE_MIME & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((HTTP_HVALUE_SSE_MIME & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  http_set_header(h,FVar7,FVar6);
  FVar7 = HTTP_HVALUE_NO_CACHE;
  FVar6 = HTTP_HEADER_CACHE_CONTROL;
  if ((((~(uint)HTTP_HVALUE_NO_CACHE & 6) != 0) && (HTTP_HVALUE_NO_CACHE != 0)) &&
     ((HTTP_HVALUE_NO_CACHE & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((HTTP_HVALUE_NO_CACHE & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  http_set_header(h,FVar6,FVar7);
  FVar6 = HTTP_HEADER_CONTENT_ENCODING;
  FVar7 = fiobj_str_new("identity",8);
  http_set_header(h,FVar6,FVar7);
  *(undefined1 *)((h->private_data).flag + 0x102) = 1;
  htt1p_finish(h);
  protocol = (fio_protocol_s *)fio_malloc(0x38);
  if (protocol != (fio_protocol_s *)0x0) {
    phVar8 = (http_sse_s *)fio_malloc(0x68);
    protocol->on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol->on_ready = http1_sse_on_ready;
    protocol->on_shutdown = http1_sse_on_shutdown;
    protocol->on_close = http1_sse_on_close;
    protocol->ping = http1_sse_ping;
    protocol->rsv = 0;
    protocol[1].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)phVar8;
    if (phVar8 != (http_sse_s *)0x0) {
      p_Var3 = sse->on_ready;
      p_Var4 = sse->on_shutdown;
      p_Var5 = sse->on_close;
      pvVar2 = sse->udata;
      phVar8->on_open = sse->on_open;
      phVar8->on_ready = p_Var3;
      phVar8->udata = pvVar2;
      phVar8->on_shutdown = p_Var4;
      phVar8->on_close = p_Var5;
      phVar8[1].on_open = uuid;
      phVar8[1].on_ready = (_func_void_http_sse_s_ptr *)&HTTP1_VTABLE;
      phVar8[1].on_shutdown = (_func_void_http_sse_s_ptr *)0x0;
      phVar8[1].on_close = (_func_void_http_sse_s_ptr *)&phVar8[1].on_close;
      phVar8[1].udata = &phVar8[1].on_close;
      phVar8[2].on_open = (_func_void_http_sse_s_ptr *)0x0;
      *(undefined1 *)&phVar8[2].on_ready = 0;
      *(undefined1 *)((long)&phVar8[2].on_ready + 7) = local_91;
      *(undefined2 *)((long)&phVar8[2].on_ready + 5) = local_93;
      *(undefined4 *)((long)&phVar8[2].on_ready + 1) = local_97;
      phVar8[2].on_shutdown = (_func_void_http_sse_s_ptr *)0x1;
      fio_timeout_set((intptr_t)uuid,*(uint8_t *)(*(long *)((h->private_data).flag + 0x38) + 0x79));
      if (sse->on_open != (_func_void_http_sse_s_ptr *)0x0) {
        (*sse->on_open)(phVar8);
      }
      fio_attach((intptr_t)uuid,protocol);
      return 0;
    }
  }
  fio_close(*(intptr_t *)((h->private_data).flag + 0x30));
  if (sse->on_close != (_func_void_http_sse_s_ptr *)0x0) {
    (*sse->on_close)(sse);
  }
  return -1;
}

Assistant:

static int http1_upgrade2sse(http_s *h, http_sse_s *sse) {
  const intptr_t uuid = handle2pr(h)->p.uuid;
  /* send response */
  h->status = 200;
  http_set_header(h, HTTP_HEADER_CONTENT_TYPE, fiobj_dup(HTTP_HVALUE_SSE_MIME));
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL,
                  fiobj_dup(HTTP_HVALUE_NO_CACHE));
  http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                  fiobj_str_new("identity", 8));
  handle2pr(h)->stop = 1;
  htt1p_finish(h); /* avoid the enforced content length in http_finish */

  /* switch protocol to SSE */
  http1_sse_fio_protocol_s *sse_pr = fio_malloc(sizeof(*sse_pr));
  if (!sse_pr)
    goto failed;
  *sse_pr = (http1_sse_fio_protocol_s){
      .p =
          {
              .on_ready = http1_sse_on_ready,
              .on_shutdown = http1_sse_on_shutdown,
              .on_close = http1_sse_on_close,
              .ping = http1_sse_ping,
          },
      .sse = fio_malloc(sizeof(*(sse_pr->sse))),
  };

  if (!sse_pr->sse)
    goto failed;

  http_sse_init(sse_pr->sse, uuid, &HTTP1_VTABLE, sse);
  fio_timeout_set(uuid, handle2pr(h)->p.settings->ws_timeout);
  if (sse->on_open)
    sse->on_open(&sse_pr->sse->sse);
  fio_attach(uuid, &sse_pr->p);
  return 0;

failed:
  fio_close(handle2pr(h)->p.uuid);
  if (sse->on_close)
    sse->on_close(sse);
  return -1;
  (void)sse;
}